

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall cmFileCopier::SetPermissions(cmFileCopier *this,char *toFile,mode_t permissions)

{
  char *__s;
  cmCommand *this_00;
  bool bVar1;
  size_t sVar2;
  bool bVar3;
  ostringstream e;
  string local_1b8;
  undefined1 local_198 [376];
  
  bVar3 = true;
  if (permissions != 0) {
    bVar1 = cmsys::SystemTools::SetPermissions(toFile,permissions,false);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      __s = this->Name;
      if (__s == (char *)0x0) {
        std::ios::clear((int)&local_1b8 + (int)*(_func_int **)(local_198._0_8_ + -0x18) + 0x20);
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198," cannot set permissions on \"",0x1c);
      if (toFile == (char *)0x0) {
        std::ios::clear((int)&local_1b8 + (int)*(_func_int **)(local_198._0_8_ + -0x18) + 0x20);
      }
      else {
        sVar2 = strlen(toFile);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,toFile,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\"",1);
      this_00 = &this->FileCommand->super_cmCommand;
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(this_00,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool SetPermissions(const char* toFile, mode_t permissions)
    {
    if(permissions && !cmSystemTools::SetPermissions(toFile, permissions))
      {
      std::ostringstream e;
      e << this->Name << " cannot set permissions on \"" << toFile << "\"";
      this->FileCommand->SetError(e.str());
      return false;
      }
    return true;
    }